

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::Tex2DShader::Tex2DShader(Tex2DShader *this)

{
  ShaderProgramDeclaration *pSVar1;
  allocator<char> local_2b1;
  string local_2b0;
  FragmentSource local_290;
  allocator<char> local_269;
  string local_268;
  VertexSource local_248;
  allocator<char> local_221;
  string local_220;
  Uniform local_200;
  FragmentOutput local_1d8;
  VertexToFragmentVarying local_1d4;
  allocator<char> local_1c9;
  string local_1c8;
  VertexAttribute local_1a8;
  allocator<char> local_169;
  string local_168;
  VertexAttribute local_148;
  ShaderProgramDeclaration local_120;
  Tex2DShader *local_10;
  Tex2DShader *this_local;
  
  local_10 = this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"a_position",&local_169);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_148,&local_168,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_120,&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"a_coord",&local_1c9);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1a8,&local_1c8,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1a8);
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying(&local_1d4,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1d4);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1d8,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"u_sampler0",&local_221);
  sglr::pdec::Uniform::Uniform(&local_200,&local_220,TYPE_SAMPLER_2D);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,
             "attribute highp vec4 a_position;\nattribute mediump vec2 a_coord;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_269);
  sglr::pdec::VertexSource::VertexSource(&local_248,&local_268);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,
             "uniform sampler2D u_sampler0;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tgl_FragColor = texture2D(u_sampler0, v_coord);\n}\n"
             ,&local_2b1);
  sglr::pdec::FragmentSource::FragmentSource(&local_290,&local_2b0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_290);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::FragmentSource::~FragmentSource(&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  sglr::pdec::VertexSource::~VertexSource(&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  sglr::pdec::Uniform::~Uniform(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_120);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_0327a5c0;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_0327a5f8;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_0327a610;
  return;
}

Assistant:

Tex2DShader (void)
		: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::Uniform("u_sampler0", glu::TYPE_SAMPLER_2D)
					<< sglr::pdec::VertexSource("attribute highp vec4 a_position;\n"
												"attribute mediump vec2 a_coord;\n"
												"varying mediump vec2 v_coord;\n"
												"void main (void)\n"
												"{\n"
												"	gl_Position = a_position;\n"
												"	v_coord = a_coord;\n"
												"}\n")
					<< sglr::pdec::FragmentSource("uniform sampler2D u_sampler0;\n"
												  "varying mediump vec2 v_coord;\n"
												  "void main (void)\n"
												  "{\n"
												  "	gl_FragColor = texture2D(u_sampler0, v_coord);\n"
												  "}\n"))
	{
	}